

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ip.cpp
# Opt level: O0

void zmq::assert_success_or_recoverable(fd_t s_,int rc_)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  int in_ESI;
  int in_EDI;
  bool bVar4;
  char *errstr;
  int rc;
  socklen_t len;
  int err;
  socklen_t local_10;
  int local_c [3];
  
  if (in_ESI == -1) {
    local_c[0] = 0;
    local_10 = 4;
    iVar1 = getsockopt(in_EDI,1,4,local_c,&local_10);
    if (iVar1 == -1) {
      piVar2 = __errno_location();
      local_c[0] = *piVar2;
    }
    iVar1 = local_c[0];
    if (local_c[0] != 0) {
      piVar2 = __errno_location();
      *piVar2 = iVar1;
      piVar2 = __errno_location();
      bVar4 = true;
      if (*piVar2 != 0x6f) {
        piVar2 = __errno_location();
        bVar4 = true;
        if (*piVar2 != 0x68) {
          piVar2 = __errno_location();
          bVar4 = true;
          if (*piVar2 != 0x67) {
            piVar2 = __errno_location();
            bVar4 = true;
            if (*piVar2 != 4) {
              piVar2 = __errno_location();
              bVar4 = true;
              if (*piVar2 != 0x6e) {
                piVar2 = __errno_location();
                bVar4 = true;
                if (*piVar2 != 0x71) {
                  piVar2 = __errno_location();
                  bVar4 = true;
                  if (*piVar2 != 0x65) {
                    piVar2 = __errno_location();
                    bVar4 = true;
                    if (*piVar2 != 100) {
                      piVar2 = __errno_location();
                      bVar4 = true;
                      if (*piVar2 != 0x66) {
                        piVar2 = __errno_location();
                        bVar4 = *piVar2 == 0x16;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      if (!bVar4) {
        piVar2 = __errno_location();
        pcVar3 = strerror(*piVar2);
        fprintf(_stderr,"%s (%s:%d)\n",pcVar3,
                "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/ip.cpp"
                ,0x361);
        fflush(_stderr);
        zmq_abort((char *)0x1e4b7f);
      }
    }
  }
  return;
}

Assistant:

void zmq::assert_success_or_recoverable (zmq::fd_t s_, int rc_)
{
#ifdef ZMQ_HAVE_WINDOWS
    if (rc_ != SOCKET_ERROR) {
        return;
    }
#else
    if (rc_ != -1) {
        return;
    }
#endif

    //  Check whether an error occurred
    int err = 0;
#if defined ZMQ_HAVE_HPUX || defined ZMQ_HAVE_VXWORKS
    int len = sizeof err;
#else
    socklen_t len = sizeof err;
#endif

    const int rc = getsockopt (s_, SOL_SOCKET, SO_ERROR,
                               reinterpret_cast<char *> (&err), &len);

    //  Assert if the error was caused by 0MQ bug.
    //  Networking problems are OK. No need to assert.
#ifdef ZMQ_HAVE_WINDOWS
    zmq_assert (rc == 0);
    if (err != 0) {
        wsa_assert (err == WSAECONNREFUSED || err == WSAECONNRESET
                    || err == WSAECONNABORTED || err == WSAEINTR
                    || err == WSAETIMEDOUT || err == WSAEHOSTUNREACH
                    || err == WSAENETUNREACH || err == WSAENETDOWN
                    || err == WSAENETRESET || err == WSAEACCES
                    || err == WSAEINVAL || err == WSAEADDRINUSE);
    }
#else
    //  Following code should handle both Berkeley-derived socket
    //  implementations and Solaris.
    if (rc == -1)
        err = errno;
    if (err != 0) {
        errno = err;
        errno_assert (errno == ECONNREFUSED || errno == ECONNRESET
                      || errno == ECONNABORTED || errno == EINTR
                      || errno == ETIMEDOUT || errno == EHOSTUNREACH
                      || errno == ENETUNREACH || errno == ENETDOWN
                      || errno == ENETRESET || errno == EINVAL);
    }
#endif
}